

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

char * callscrn_num_to_string
                 (char *string_buf,size_t string_buf_len,uint8_t *num_buf,size_t num_buf_len)

{
  ulong uVar1;
  char *pcVar2;
  char *pstr;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  pcVar2 = string_buf;
  if (num_buf_len != 0) {
    uVar1 = 1;
    lVar4 = 0;
    do {
      uVar3 = uVar1;
      string_buf[uVar3 - 1] = ""[num_buf[lVar4] >> 4];
      if (string_buf_len - 1 <= uVar3) {
        string_buf = string_buf + uVar3;
        goto LAB_001048e1;
      }
      string_buf[uVar3] = ""[num_buf[lVar4] & 0xf];
    } while ((uVar3 + 1 < string_buf_len - 1) &&
            (bVar5 = num_buf_len - 1 != lVar4, uVar1 = uVar3 + 2, lVar4 = lVar4 + 1, bVar5));
    string_buf = string_buf + uVar3 + 1;
  }
LAB_001048e1:
  *string_buf = '\0';
  return pcVar2;
}

Assistant:

char* callscrn_num_to_string(char *string_buf, size_t string_buf_len, uint8_t *num_buf, size_t num_buf_len) {
    char  *pstr = string_buf;
    size_t i, j;

    j = 0;

    for (i = 0; i < num_buf_len; i++) {
        int pn_digit = num_buf[i] >> 4;

        *pstr++ = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;

        pn_digit = num_buf[i] & 0x0f;
        *pstr++  = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;
    }

    *pstr = '\0';
    return string_buf;
}